

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O0

void c_insert(EditLine *el,wchar_t num)

{
  wchar_t wVar1;
  wchar_t *local_20;
  wchar_t *cp;
  wchar_t num_local;
  EditLine *el_local;
  
  if (((el->el_line).lastchar + num < (el->el_line).limit) ||
     (wVar1 = ch_enlargebufs(el,(long)num), wVar1 != L'\0')) {
    if ((el->el_line).cursor < (el->el_line).lastchar) {
      for (local_20 = (el->el_line).lastchar; (el->el_line).cursor <= local_20;
          local_20 = local_20 + -1) {
        local_20[num] = *local_20;
      }
    }
    (el->el_line).lastchar = (el->el_line).lastchar + num;
  }
  return;
}

Assistant:

libedit_private void
c_insert(EditLine *el, int num)
{
	wchar_t *cp;

	if (el->el_line.lastchar + num >= el->el_line.limit) {
		if (!ch_enlargebufs(el, (size_t)num))
			return;		/* can't go past end of buffer */
	}

	if (el->el_line.cursor < el->el_line.lastchar) {
		/* if I must move chars */
		for (cp = el->el_line.lastchar; cp >= el->el_line.cursor; cp--)
			cp[num] = *cp;
	}
	el->el_line.lastchar += num;
}